

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_null(archive_write *a,size_t size)

{
  ulong uVar1;
  int iVar2;
  uchar *__s;
  uchar *__s_00;
  ulong in_RSI;
  archive_write *in_RDI;
  size_t wsize;
  int r;
  uchar *old;
  uchar *p;
  size_t remaining;
  size_t in_stack_ffffffffffffffc0;
  ulong size_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  ulong local_18;
  int local_4;
  
  local_18 = *(ulong *)((long)in_RDI->format_data + 0x102e0);
  __s = wb_buffptr(in_RDI);
  if (local_18 < in_RSI) {
    memset(__s,0,local_18);
    local_4 = wb_consume((archive_write *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc0);
    if (local_4 == 0) {
      __s_00 = wb_buffptr(in_RDI);
      memset(__s_00,0,(long)__s - (long)__s_00);
      uVar1 = *(ulong *)((long)in_RDI->format_data + 0x102e0);
      for (local_18 = in_RSI - local_18; local_18 != 0; local_18 = local_18 - size_00) {
        size_00 = local_18;
        if (uVar1 < local_18) {
          size_00 = uVar1;
        }
        iVar2 = wb_consume((archive_write *)CONCAT44(local_4,in_stack_ffffffffffffffc8),size_00);
        if (iVar2 != 0) {
          return iVar2;
        }
        local_4 = 0;
      }
      local_4 = 0;
    }
  }
  else {
    memset(__s,0,in_RSI);
    local_4 = wb_consume((archive_write *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc0);
  }
  return local_4;
}

Assistant:

static int
write_null(struct archive_write *a, size_t size)
{
	size_t remaining;
	unsigned char *p, *old;
	int r;

	remaining = wb_remaining(a);
	p = wb_buffptr(a);
	if (size <= remaining) {
		memset(p, 0, size);
		return (wb_consume(a, size));
	}
	memset(p, 0, remaining);
	r = wb_consume(a, remaining);
	if (r != ARCHIVE_OK)
		return (r);
	size -= remaining;
	old = p;
	p = wb_buffptr(a);
	memset(p, 0, old - p);
	remaining = wb_remaining(a);
	while (size) {
		size_t wsize = size;

		if (wsize > remaining)
			wsize = remaining;
		r = wb_consume(a, wsize);
		if (r != ARCHIVE_OK)
			return (r);
		size -= wsize;
	}
	return (ARCHIVE_OK);
}